

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
TargetPropertyEntryString::TargetPropertyEntryString
          (TargetPropertyEntryString *this,string *propertyValue,cmListFileBacktrace *backtrace,
          cmLinkImplItem *item)

{
  cmLinkImplItem *item_local;
  cmListFileBacktrace *backtrace_local;
  string *propertyValue_local;
  TargetPropertyEntryString *this_local;
  
  cmGeneratorTarget::TargetPropertyEntry::TargetPropertyEntry(&this->super_TargetPropertyEntry,item)
  ;
  (this->super_TargetPropertyEntry)._vptr_TargetPropertyEntry =
       (_func_int **)&PTR__TargetPropertyEntryString_00ac8b98;
  std::__cxx11::string::string((string *)&this->PropertyValue,(string *)propertyValue);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,backtrace);
  return;
}

Assistant:

TargetPropertyEntryString(std::string propertyValue,
                            cmListFileBacktrace backtrace,
                            cmLinkImplItem const& item = NoLinkImplItem)
    : cmGeneratorTarget::TargetPropertyEntry(item)
    , PropertyValue(std::move(propertyValue))
    , Backtrace(std::move(backtrace))
  {
  }